

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

void __thiscall
stick::String::append<char_const*,stick::String>(String *this,char *param_2,undefined8 *param_3)

{
  ulong uVar1;
  Size SVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  ulong uVar6;
  
  sVar5 = strlen(param_2);
  if (sVar5 + param_3[1] != 0) {
    SVar2 = this->m_length;
    uVar6 = sVar5 + param_3[1] + SVar2;
    if ((this->m_capacity < uVar6) && (uVar1 = uVar6 * 2, this->m_capacity < uVar1)) {
      pcVar3 = this->m_cStr;
      iVar4 = (*this->m_allocator->_vptr_Allocator[2])(this->m_allocator,uVar1 | 1,1);
      this->m_cStr = (char *)CONCAT44(extraout_var,iVar4);
      memset((char *)CONCAT44(extraout_var,iVar4),0,uVar1 | 1);
      if (this->m_cStr == (char *)0x0) {
        __assert_fail("m_cStr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                      ,0x1a0,"void stick::String::reserve(Size)");
      }
      if (pcVar3 != (char *)0x0) {
        strcpy(this->m_cStr,pcVar3);
        (*this->m_allocator->_vptr_Allocator[3])();
      }
      this->m_capacity = uVar1;
    }
    this->m_length = uVar6;
    strcpy(this->m_cStr + SVar2,param_2);
    pcVar3 = (char *)*param_3;
    if (pcVar3 != (char *)0x0) {
      sVar5 = strlen(param_2);
      strcpy(this->m_cStr + sVar5 + SVar2,pcVar3);
    }
  }
  return;
}

Assistant:

inline void String::append(AppendVariadicFlag _flag, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    if (!len)
        return;
    Size off = m_length;
    preAppend(m_length + len);
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(*this, off, _args))... };
    STICK_UNUSED(unpack2);
}